

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::Test::RecordProperty(char *key,int value)

{
  Message value_message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  String local_30;
  int local_1c;
  
  local_1c = value;
  Message::Message((Message *)&local_38);
  Message::operator<<((Message *)&local_38,&local_1c);
  internal::StringStreamToString((internal *)&local_30,local_38.ptr_);
  RecordProperty(key,local_30.c_str_);
  internal::String::~String(&local_30);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_38);
  return;
}

Assistant:

void Test::RecordProperty(const char* key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}